

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseBindVarOpt(WastParser *this,string *name)

{
  bool bVar1;
  string_view local_90;
  string local_80;
  Token token;
  
  bVar1 = PeekMatch(this,Last_String);
  if (bVar1) {
    Consume(&token,this);
    local_90 = Token::text(&token);
    string_view::to_string_abi_cxx11_(&local_80,&local_90);
    std::__cxx11::string::operator=((string *)name,(string *)&local_80);
    std::__cxx11::string::_M_dispose();
  }
  return bVar1;
}

Assistant:

bool WastParser::ParseBindVarOpt(std::string* name) {
  WABT_TRACE(ParseBindVarOpt);
  if (!PeekMatch(TokenType::Var)) {
    return false;
  }
  Token token = Consume();
  *name = token.text().to_string();
  return true;
}